

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O1

void __thiscall CGameClient::ProcessTriggeredEvents(CGameClient *this,int Events,vec2 Pos)

{
  if (this->m_SuppressEvents == false) {
    if ((Events & 1U) != 0) {
      CSounds::PlayAt(this->m_pSounds,2,0xf,1.0,Pos);
    }
    if ((Events & 2U) != 0) {
      CEffects::AirJump(this->m_pEffects,Pos);
    }
    if ((Events & 4U) != 0) {
      CSounds::PlayAt(this->m_pSounds,2,0x16,1.0,Pos);
    }
    if ((Events & 8U) != 0) {
      CSounds::PlayAt(this->m_pSounds,2,0x15,1.0,Pos);
    }
    if ((Events & 0x10U) != 0) {
      CSounds::PlayAt(this->m_pSounds,2,0x17,1.0,Pos);
      return;
    }
  }
  return;
}

Assistant:

void CGameClient::ProcessTriggeredEvents(int Events, vec2 Pos)
{
	if(m_SuppressEvents)
		return;

	if(Events&COREEVENTFLAG_GROUND_JUMP)
		m_pSounds->PlayAt(CSounds::CHN_WORLD, SOUND_PLAYER_JUMP, 1.0f, Pos);
	if(Events&COREEVENTFLAG_AIR_JUMP)
		m_pEffects->AirJump(Pos);
	if(Events&COREEVENTFLAG_HOOK_ATTACH_PLAYER)
		m_pSounds->PlayAt(CSounds::CHN_WORLD, SOUND_HOOK_ATTACH_PLAYER, 1.0f, Pos);
	if(Events&COREEVENTFLAG_HOOK_ATTACH_GROUND)
		m_pSounds->PlayAt(CSounds::CHN_WORLD, SOUND_HOOK_ATTACH_GROUND, 1.0f, Pos);
	if(Events&COREEVENTFLAG_HOOK_HIT_NOHOOK)
		m_pSounds->PlayAt(CSounds::CHN_WORLD, SOUND_HOOK_NOATTACH, 1.0f, Pos);
	/*if(Events&COREEVENTFLAG_HOOK_LAUNCH)
		m_pSounds->PlayAt(CSounds::CHN_WORLD, SOUND_HOOK_LOOP, 1.0f, Pos);
	if(Events&COREEVENTFLAG_HOOK_RETRACT)
		m_pSounds->PlayAt(CSounds::CHN_WORLD, SOUND_PLAYER_JUMP, 1.0f, Pos);*/
}